

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa_rewrite_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::SSARewriter::GenerateSSAReplacements(SSARewriter *this,BasicBlock *bb)

{
  Op OVar1;
  bool bVar2;
  BasicBlock *__range2;
  Instruction *inst;
  Instruction *inst_00;
  bool bVar3;
  
  inst_00 = (bb->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
            super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
  do {
    bVar3 = inst_00 == &(bb->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_;
    if (bVar3) {
LAB_0019d538:
      SealBlock(this,bb);
      return bVar3;
    }
    OVar1 = inst_00->opcode_;
    if (OVar1 == OpStore) {
LAB_0019d50a:
      ProcessStore(this,inst_00,bb);
    }
    else if (OVar1 == OpLoad) {
      bVar2 = ProcessLoad(this,inst_00,bb);
      if (!bVar2) {
        if (!bVar3) {
          return bVar3;
        }
        goto LAB_0019d538;
      }
    }
    else if (OVar1 == OpVariable) goto LAB_0019d50a;
    inst_00 = (inst_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  } while( true );
}

Assistant:

bool SSARewriter::GenerateSSAReplacements(BasicBlock* bb) {
#if SSA_REWRITE_DEBUGGING_LEVEL > 1
  std::cerr << "Generating SSA replacements for block: " << bb->id() << "\n";
  std::cerr << bb->PrettyPrint(SPV_BINARY_TO_TEXT_OPTION_FRIENDLY_NAMES)
            << "\n";
#endif

  for (auto& inst : *bb) {
    auto opcode = inst.opcode();
    if (opcode == spv::Op::OpStore || opcode == spv::Op::OpVariable) {
      ProcessStore(&inst, bb);
    } else if (inst.opcode() == spv::Op::OpLoad) {
      if (!ProcessLoad(&inst, bb)) {
        return false;
      }
    }
  }

  // Seal |bb|. This means that all the stores in it have been scanned and
  // it's ready to feed them into its successors.
  SealBlock(bb);

#if SSA_REWRITE_DEBUGGING_LEVEL > 1
  PrintPhiCandidates();
  PrintReplacementTable();
  std::cerr << "\n\n";
#endif
  return true;
}